

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O2

void __thiscall avro::GenericArray::~GenericArray(GenericArray *this)

{
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::~vector(&this->value_);
  boost::detail::shared_count::~shared_count(&(this->super_GenericContainer).schema_.pn);
  return;
}

Assistant:

class AVRO_DECL GenericArray : public GenericContainer {
public:
    /**
     * The contents type for the array.
     */
    typedef std::vector<GenericDatum> Value;

    /**
     * Constructs a generic array corresponding to the given schema \p schema,
     * which should be of Avro type array.
     */
    GenericArray(const NodePtr& schema) : GenericContainer(AVRO_ARRAY, schema) {
    }

    /**
     * Returns the contents of this array.
     */
    const Value& value() const {
        return value_;
    }

    /**
     * Returns the reference to the contents of this array.
     */
    Value& value() {
        return value_;
    }
private:
    Value value_;
}